

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall kj::TaskSet::~TaskSet(TaskSet *this)

{
  PromiseFulfiller<void> *pPVar1;
  Disposer *pDVar2;
  Task *node;
  long in_FS_OFFSET;
  
  destroyTasks(this);
  pPVar1 = (this->emptyFulfiller).ptr.ptr;
  if (pPVar1 != (PromiseFulfiller<void> *)0x0) {
    (this->emptyFulfiller).ptr.ptr = (PromiseFulfiller<void> *)0x0;
    pDVar2 = (this->emptyFulfiller).ptr.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[-2] +
                      (long)&(pPVar1->super_PromiseRejector)._vptr_PromiseRejector);
  }
  node = (this->tasks).ptr.ptr;
  if (node != (Task *)0x0) {
    (this->tasks).ptr.ptr = (Task *)0x0;
    kj::_::PromiseDisposer::dispose(&node->super_PromiseArenaMember);
  }
  if (*(long *)(in_FS_OFFSET + -0x28) == 0) {
    return;
  }
  AsyncObject::failed();
}

Assistant:

TaskSet::~TaskSet() noexcept(false) {
  destroyTasks();
}